

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  uchar uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  
  piVar8 = stbiw__encode_png_line::mapping;
  if (y == 0) {
    piVar8 = stbiw__encode_png_line::firstmap;
  }
  iVar3 = piVar8[filter_type];
  iVar5 = -stride_bytes;
  iVar11 = ~y + height;
  if (stbi__flip_vertically_on_write == 0) {
    iVar5 = stride_bytes;
    iVar11 = y;
  }
  lVar15 = (long)(iVar11 * stride_bytes);
  lVar9 = (long)iVar5;
  if (0 < n) {
    uVar18 = 0;
    do {
      switch(iVar3) {
      case 0:
      case 1:
      case 5:
      case 6:
        uVar10 = pixels[uVar18 + lVar15];
        break;
      case 2:
      case 4:
        uVar10 = pixels[uVar18 + lVar15] - pixels[uVar18 + (lVar15 - lVar9)];
        break;
      case 3:
        uVar10 = pixels[uVar18 + lVar15] - (pixels[uVar18 + (lVar15 - lVar9)] >> 1);
        break;
      default:
        goto switchD_001045cd_default;
      }
      line_buffer[uVar18] = uVar10;
switchD_001045cd_default:
      uVar18 = uVar18 + 1;
    } while ((uint)n != uVar18);
  }
  if (n < width * n) {
    lVar7 = (long)n;
    lVar1 = lVar7 + lVar15;
    lVar19 = lVar1 - lVar9;
    lVar13 = 0;
    do {
      switch(iVar3) {
      case 0:
        uVar10 = pixels[lVar13 + lVar1];
        break;
      case 1:
      case 6:
        uVar10 = pixels[lVar13 + lVar1] - pixels[lVar13 + lVar15];
        break;
      case 2:
        uVar10 = pixels[lVar13 + lVar1] - pixels[lVar13 + lVar19];
        break;
      case 3:
        uVar10 = pixels[lVar13 + lVar1] -
                 (char)((uint)pixels[lVar13 + lVar19] + (uint)pixels[lVar13 + lVar15] >> 1);
        break;
      case 4:
        bVar16 = pixels[lVar13 + lVar15];
        bVar2 = pixels[lVar13 + lVar19];
        bVar17 = pixels[lVar13 + (lVar15 - lVar9)];
        iVar11 = ((uint)bVar2 + (uint)bVar16) - (uint)bVar17;
        uVar6 = iVar11 - (uint)bVar16;
        uVar4 = -uVar6;
        if (0 < (int)uVar6) {
          uVar4 = uVar6;
        }
        uVar14 = iVar11 - (uint)bVar2;
        uVar6 = -uVar14;
        if (0 < (int)uVar14) {
          uVar6 = uVar14;
        }
        uVar12 = iVar11 - (uint)bVar17;
        uVar14 = -uVar12;
        if (0 < (int)uVar12) {
          uVar14 = uVar12;
        }
        if (uVar6 <= uVar14) {
          bVar17 = bVar2;
        }
        if (uVar14 < uVar4) {
          bVar16 = bVar17;
        }
        if (uVar6 < uVar4) {
          bVar16 = bVar17;
        }
        uVar10 = pixels[lVar13 + lVar1] - bVar16;
        break;
      case 5:
        uVar10 = pixels[lVar13 + lVar1] - (pixels[lVar13 + lVar15] >> 1);
        break;
      default:
        goto switchD_00104649_default;
      }
      line_buffer[lVar13 + lVar7] = uVar10;
switchD_00104649_default:
      lVar13 = lVar13 + 1;
    } while (width * n - lVar7 != lVar13);
  }
  return;
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes,
                                   int width, int height, int y, int n,
                                   int filter_type, signed char *line_buffer) {
  static int mapping[] = {0, 1, 2, 3, 4};
  static int firstmap[] = {0, 1, 0, 5, 6};
  int *mymap = (y != 0) ? mapping : firstmap;
  int i;
  int type = mymap[filter_type];
  unsigned char *z =
      pixels +
      stride_bytes * (stbi__flip_vertically_on_write ? height - 1 - y : y);
  int signed_stride =
      stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;
  for (i = 0; i < n; ++i) {
    switch (type) {
      case 0:
        line_buffer[i] = z[i];
        break;
      case 1:
        line_buffer[i] = z[i];
        break;
      case 2:
        line_buffer[i] = z[i] - z[i - signed_stride];
        break;
      case 3:
        line_buffer[i] = z[i] - (z[i - signed_stride] >> 1);
        break;
      case 4:
        line_buffer[i] =
            (signed char)(z[i] - stbiw__paeth(0, z[i - signed_stride], 0));
        break;
      case 5:
        line_buffer[i] = z[i];
        break;
      case 6:
        line_buffer[i] = z[i];
        break;
    }
  }
  for (i = n; i < width * n; ++i) {
    switch (type) {
      case 0:
        line_buffer[i] = z[i];
        break;
      case 1:
        line_buffer[i] = z[i] - z[i - n];
        break;
      case 2:
        line_buffer[i] = z[i] - z[i - signed_stride];
        break;
      case 3:
        line_buffer[i] = z[i] - ((z[i - n] + z[i - signed_stride]) >> 1);
        break;
      case 4:
        line_buffer[i] = z[i] - stbiw__paeth(z[i - n], z[i - signed_stride],
                                             z[i - signed_stride - n]);
        break;
      case 5:
        line_buffer[i] = z[i] - (z[i - n] >> 1);
        break;
      case 6:
        line_buffer[i] = z[i] - stbiw__paeth(z[i - n], 0, 0);
        break;
    }
  }
}